

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::GridSample_x86_avx::forward
          (GridSample_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Mat *src;
  int *piVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  bool bVar16;
  int iVar17;
  pointer pMVar18;
  Option *opt_00;
  int iVar19;
  long lVar20;
  float *pfVar21;
  int iVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  float *pfVar26;
  int *offset_ptr;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  Mat local_f8;
  size_t local_b0;
  int local_a8;
  uint local_a4;
  pointer local_a0;
  Mat local_98;
  undefined1 auStack_4a [2];
  float local_48 [6];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_a0 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_a8 = src->elempack;
  iVar22 = src->c;
  local_a4 = src->dims;
  local_b0 = src->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (float *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8._20_8_ = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  pMVar18 = (pointer)opt;
  if (src[1].elempack == 1) {
    if (&local_98 != src + 1) {
      piVar4 = src[1].refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_98.data = src[1].data;
      local_98.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_98.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_98.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_98.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_98.elempack = src[1].elempack;
      local_98.allocator = src[1].allocator;
      uVar12 = src[1].dims;
      uVar13 = src[1].w;
      uVar14 = src[1].h;
      uVar15 = src[1].d;
      local_98.c = src[1].c;
      local_98.cstep = src[1].cstep;
      local_98.dims = uVar12;
      local_98.w = uVar13;
      local_98.h = uVar14;
      local_98.d = uVar15;
    }
  }
  else {
    convert_packing(src + 1,&local_98,1,opt);
  }
  if (local_a4 == 3) {
    iVar19 = local_98.h;
    iVar17 = local_98.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar19 = local_98.c;
      iVar17 = local_98.h;
    }
    Mat::create(local_a0,iVar17,iVar19,iVar22,local_b0,local_a8,opt->blob_allocator);
    iVar22 = -100;
    if ((local_a0->data == (void *)0x0) || ((long)local_a0->c * local_a0->cstep == 0))
    goto LAB_0059a048;
    iVar22 = (this->super_GridSample).sample_type;
    pMVar18 = local_a0;
    if (iVar22 == 1) {
      Mat::create(&local_f8,iVar17,iVar19,local_b0 * 6,6,opt->workspace_allocator);
      iVar22 = -100;
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_0059a048;
      iVar2 = (this->super_GridSample).padding_mode;
      if (iVar2 == 3) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else if (iVar2 == 2) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else {
        if (iVar2 != 1) {
          forward();
          goto LAB_0059a048;
        }
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      iVar22 = (this->super_GridSample).sample_type;
    }
    if (iVar22 == 2) {
      Mat::create(&local_f8,iVar17,iVar19,1,local_b0,1,opt->workspace_allocator);
      iVar22 = -100;
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_0059a048;
      iVar2 = (this->super_GridSample).padding_mode;
      if (iVar2 == 3) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else if (iVar2 == 2) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else {
        if (iVar2 != 1) {
          forward();
          goto LAB_0059a048;
        }
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_f8,iVar17,iVar19,local_b0 * 0x12,0x12,opt->workspace_allocator);
      if ((float *)local_f8.data == (float *)0x0) goto LAB_0059a043;
      iVar22 = -100;
      if ((long)local_f8.c * local_f8.cstep == 0) goto LAB_0059a048;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else if (iVar19 == 2) {
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_0059a048;
        }
        uVar3 = (this->super_GridSample).permute_fusion;
        pMVar18 = (pointer)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
    }
LAB_00599ac7:
    bVar16 = false;
  }
  else {
    if (local_a4 != 4) goto LAB_00599ac7;
    iVar19 = local_98.d;
    iVar17 = local_98.w;
    iVar2 = local_98.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar19 = local_98.c;
      iVar17 = local_98.h;
      iVar2 = local_98.d;
    }
    Mat::create(local_a0,iVar17,iVar2,iVar19,iVar22,local_b0,local_a8,opt->blob_allocator);
    if ((local_a0->data == (void *)0x0) || ((long)local_a0->c * local_a0->cstep == 0)) {
LAB_0059a043:
      iVar22 = -100;
      goto LAB_0059a048;
    }
    iVar22 = (this->super_GridSample).sample_type;
    if (iVar22 == 1) {
      Mat::create(&local_f8,iVar17,iVar2,iVar19,local_b0 * 0xb,0xb,opt->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_0059a043;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
      else if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
      else {
        if (iVar22 != 1) {
          forward();
          goto LAB_0059a043;
        }
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
      iVar22 = (this->super_GridSample).sample_type;
    }
    if (iVar22 == 2) {
      Mat::create(&local_f8,iVar17,iVar2,iVar19,1,local_b0,1,opt->workspace_allocator);
      iVar22 = -100;
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_0059a048;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
      else if (iVar19 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_0059a048;
        }
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,iVar22);
        }
      }
    }
    bVar16 = true;
    iVar22 = -100;
    pMVar18 = (pointer)this;
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_0059a048;
    }
  }
  iVar19 = 0;
  iVar22 = iVar19;
  if (local_a8 != 1) {
    opt_00 = (Option *)(ulong)local_a4;
    if (local_a8 != 4) {
      iVar22 = 0;
      if (local_a8 != 8) goto LAB_0059a048;
      if (local_a4 == 3) {
        iVar17 = (this->super_GridSample).sample_type;
        if (iVar17 == 3) {
          gridsample_2d_bicubic_apply_interpolation_p8(src,local_a0,&local_f8,opt_00);
          iVar22 = iVar19;
          goto LAB_0059a048;
        }
        if (iVar17 != 2) {
          if (iVar17 == 1) {
            gridsample_2d_bilinear_apply_interpolation_p8(src,local_a0,&local_f8,opt_00);
            iVar22 = iVar19;
          }
          goto LAB_0059a048;
        }
      }
      else {
        iVar22 = iVar19;
        if (!bVar16) goto LAB_0059a048;
        iVar17 = (this->super_GridSample).sample_type;
        if (iVar17 != 2) {
          if (iVar17 == 1) {
            gridsample_3d_bilinear_apply_interpolation_p8(src,local_a0,&local_f8,opt_00);
          }
          goto LAB_0059a048;
        }
      }
      gridsample_nearest_apply_interpolation_p8(src,local_a0,&local_f8,opt_00);
      iVar22 = iVar19;
      goto LAB_0059a048;
    }
    if (local_a4 == 3) {
      iVar19 = (this->super_GridSample).sample_type;
      if (iVar19 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4(src,local_a0,&local_f8,opt_00);
        goto LAB_0059a048;
      }
      if (iVar19 != 2) {
        if (iVar19 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p4(src,local_a0,&local_f8,opt_00);
        }
        goto LAB_0059a048;
      }
    }
    else {
      if (!bVar16) goto LAB_0059a048;
      iVar19 = (this->super_GridSample).sample_type;
      if (iVar19 != 2) {
        if (iVar19 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p4(src,local_a0,&local_f8,opt_00);
        }
        goto LAB_0059a048;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,local_a0,&local_f8,opt_00);
    goto LAB_0059a048;
  }
  if (local_a4 == 3) {
    iVar19 = (this->super_GridSample).sample_type;
    if (iVar19 == 3) {
      iVar19 = local_a0->c;
      if (0 < (long)iVar19) {
        iVar17 = local_a0->h * local_a0->w;
        pvVar5 = src->data;
        sVar6 = src->elemsize;
        sVar7 = src->cstep;
        pvVar23 = local_a0->data;
        sVar8 = local_a0->elemsize;
        sVar9 = local_a0->cstep;
        lVar24 = 0;
        do {
          if (0 < iVar17) {
            lVar20 = sVar6 * sVar7 * lVar24;
            pfVar21 = (float *)(sVar8 * sVar9 * lVar24 + (long)pvVar23);
            iVar22 = 0;
            pfVar26 = (float *)local_f8.data;
            do {
              fVar30 = *pfVar26;
              fVar27 = pfVar26[1];
              fVar33 = fVar30 + 1.0;
              fVar33 = fVar33 * fVar33 * (3.75 - fVar33 * 0.75) + fVar33 * -6.0 + 3.0;
              auVar34 = vinsertps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)(1.0 - fVar30)),0x10);
              fVar30 = auVar34._0_4_;
              fVar31 = auVar34._4_4_;
              fVar1 = auVar34._8_4_;
              fVar11 = auVar34._12_4_;
              auVar28._0_4_ = fVar30 * fVar30 * (fVar30 * 1.25 + -2.25);
              auVar28._4_4_ = fVar31 * fVar31 * (fVar31 * 1.25 + -2.25);
              auVar28._8_4_ = fVar1 * fVar1 * (fVar1 * 1.25 + -2.25);
              auVar28._12_4_ = fVar11 * fVar11 * (fVar11 * 1.25 + -2.25);
              auVar10 = vmovshdup_avx(auVar28);
              fVar30 = fVar27 + 1.0;
              auVar34 = vinsertps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)(1.0 - fVar27)),0x10);
              fVar27 = auVar34._0_4_;
              fVar31 = auVar34._4_4_;
              fVar1 = auVar34._8_4_;
              fVar11 = auVar34._12_4_;
              auVar34._0_4_ = fVar27 * fVar27 * (fVar27 * 1.25 + -2.25);
              auVar34._4_4_ = fVar31 * fVar31 * (fVar31 * 1.25 + -2.25);
              auVar34._8_4_ = fVar1 * fVar1 * (fVar1 * 1.25 + -2.25);
              auVar34._12_4_ = fVar11 * fVar11 * (fVar11 * 1.25 + -2.25);
              lVar25 = 2;
              do {
                auVar32 = ZEXT416(0) << 0x20;
                fVar27 = 0.0;
                if (-1 < (long)(int)pfVar26[lVar25]) {
                  fVar27 = *(float *)((long)pvVar5 + (long)(int)pfVar26[lVar25] * 4 + lVar20);
                }
                if (-1 < (long)(int)pfVar26[lVar25 + 1]) {
                  auVar32 = ZEXT416(*(uint *)((long)pvVar5 +
                                             (long)(int)pfVar26[lVar25 + 1] * 4 + lVar20));
                }
                fVar31 = 0.0;
                auVar29 = ZEXT816(0) << 0x40;
                if (-1 < (long)(int)pfVar26[lVar25 + 2]) {
                  auVar29 = ZEXT416(*(uint *)((long)pvVar5 +
                                             (long)(int)pfVar26[lVar25 + 2] * 4 + lVar20));
                }
                if (-1 < (long)(int)pfVar26[lVar25 + 3]) {
                  fVar31 = *(float *)((long)pvVar5 + (long)(int)pfVar26[lVar25 + 3] * 4 + lVar20);
                }
                auVar32 = vinsertps_avx(auVar32,auVar29,0x10);
                auVar29._0_4_ = (auVar28._0_4_ + 1.0) * auVar32._0_4_;
                auVar29._4_4_ = (auVar28._4_4_ + 1.0) * auVar32._4_4_;
                auVar29._8_4_ = (auVar28._8_4_ + 1.0) * auVar32._8_4_;
                auVar29._12_4_ = (auVar28._12_4_ + 1.0) * auVar32._12_4_;
                auVar32 = vmovshdup_avx(auVar29);
                *(float *)(auStack_4a + lVar25) =
                     (fVar27 * fVar33 + auVar29._0_4_ + auVar32._0_4_) -
                     (fVar33 + auVar28._0_4_ + 1.0 + auVar10._0_4_) * fVar31;
                lVar25 = lVar25 + 4;
              } while (lVar25 != 0x12);
              auVar10 = vmovshdup_avx(auVar34);
              fVar30 = fVar30 * fVar30 * (3.75 - fVar30 * 0.75) + fVar30 * -6.0 + 3.0;
              auVar32._0_4_ = (float)local_48._4_8_ * (auVar34._0_4_ + 1.0);
              auVar32._4_4_ = SUB84(local_48._4_8_,4) * (auVar34._4_4_ + 1.0);
              auVar32._8_4_ = (auVar34._8_4_ + 1.0) * 0.0;
              auVar32._12_4_ = (auVar34._12_4_ + 1.0) * 0.0;
              auVar28 = vmovshdup_avx(auVar32);
              *pfVar21 = (auVar28._0_4_ + auVar32._0_4_ + fVar30 * local_48[0]) -
                         (auVar10._0_4_ + auVar34._0_4_ + 1.0 + fVar30) * local_48[3];
              pfVar21 = pfVar21 + 1;
              pfVar26 = pfVar26 + 0x12;
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar17);
          }
          lVar24 = lVar24 + 1;
          iVar22 = 0;
        } while (lVar24 != iVar19);
      }
      goto LAB_0059a048;
    }
    if (iVar19 != 2) {
      if ((iVar19 == 1) && (iVar19 = local_a0->c, 0 < (long)iVar19)) {
        iVar17 = local_a0->h * local_a0->w;
        pvVar5 = src->data;
        sVar6 = src->elemsize;
        sVar7 = src->cstep;
        pvVar23 = local_a0->data;
        sVar8 = local_a0->elemsize;
        sVar9 = local_a0->cstep;
        lVar24 = 0;
        do {
          if (0 < iVar17) {
            lVar20 = sVar6 * sVar7 * lVar24;
            lVar25 = 0;
            pfVar26 = (float *)local_f8.data;
            do {
              fVar27 = 0.0;
              fVar30 = 0.0;
              if (-1 < (long)(int)*pfVar26) {
                fVar30 = *(float *)((long)pvVar5 + (long)(int)*pfVar26 * 4 + lVar20);
              }
              if (-1 < (long)(int)pfVar26[1]) {
                fVar27 = *(float *)((long)pvVar5 + (long)(int)pfVar26[1] * 4 + lVar20);
              }
              fVar31 = 0.0;
              fVar33 = 0.0;
              if (-1 < (long)(int)pfVar26[2]) {
                fVar33 = *(float *)((long)pvVar5 + (long)(int)pfVar26[2] * 4 + lVar20);
              }
              if (-1 < (long)(int)pfVar26[3]) {
                fVar31 = *(float *)((long)pvVar5 + (long)(int)pfVar26[3] * 4 + lVar20);
              }
              fVar1 = pfVar26[4];
              fVar30 = (1.0 - fVar1) * fVar30 + fVar1 * fVar27;
              *(float *)((long)pvVar23 + lVar25 * 4) =
                   (((1.0 - fVar1) * fVar33 + fVar1 * fVar31) - fVar30) * pfVar26[5] + fVar30;
              pfVar26 = pfVar26 + 6;
              lVar25 = lVar25 + 1;
            } while (iVar17 != (int)lVar25);
          }
          lVar24 = lVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar9);
          iVar22 = 0;
        } while (lVar24 != iVar19);
      }
      goto LAB_0059a048;
    }
  }
  else {
    if (!bVar16) goto LAB_0059a048;
    iVar19 = (this->super_GridSample).sample_type;
    if (iVar19 != 2) {
      if (iVar19 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1(src,local_a0,&local_f8,(Option *)pMVar18);
      }
      goto LAB_0059a048;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,local_a0,&local_f8,(Option *)pMVar18);
LAB_0059a048:
  piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((float *)local_f8.data != (float *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int GridSample_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}